

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtnm(fitsfile *gfptr,long *nmembers,int *status)

{
  int iVar1;
  int *in_RDX;
  char comment [73];
  char keyvalue [71];
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  long *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  fitsfile *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  fitsfile *in_stack_ffffffffffffffb8;
  undefined4 local_4;
  
  if (*in_RDX == 0) {
    iVar1 = ffgkey(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   (char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                   (int *)in_stack_ffffffffffffff98);
    *in_RDX = iVar1;
    if (*in_RDX == 0xca) {
      *in_RDX = 0x154;
    }
    else {
      prepare_keyvalue(in_stack_ffffffffffffff50);
      iVar1 = fits_strcasecmp(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      if (iVar1 != 0) {
        *in_RDX = 0x154;
        ffpmsg((char *)0x1cfe4c);
      }
      iVar1 = ffgkyj(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      *in_RDX = iVar1;
    }
    local_4 = *in_RDX;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffgtnm(fitsfile *gfptr,    /* FITS file pointer to grouping table        */
	   long     *nmembers, /* member count  of the groping table         */
	   int      *status)   /* return status code                         */

/*
  return the number of member HDUs in a grouping table. The fitsfile pointer
  gfptr must be positioned with the grouping table as the CHDU. The number
  of grouping table member HDUs is just the NAXIS2 value of the grouping
  table.
*/

{
  char keyvalue[FLEN_VALUE];
  char comment[FLEN_COMMENT];
  

  if(*status != 0) return(*status);

  *status = fits_read_keyword(gfptr,"EXTNAME",keyvalue,comment,status);
  
  if(*status == KEY_NO_EXIST)
    *status = NOT_GROUP_TABLE;
  else
    {
      prepare_keyvalue(keyvalue);

      if(fits_strcasecmp(keyvalue,"GROUPING") != 0)
	{
	  *status = NOT_GROUP_TABLE;
	  ffpmsg("Specified HDU is not a Grouping table (ffgtnm)");
	}

      *status = fits_read_key_lng(gfptr,"NAXIS2",nmembers,comment,status);
    }

  return(*status);
}